

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touch.cpp
# Opt level: O1

bool fs_touch(string_view path)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  string_view fname;
  ofstream f;
  long local_220;
  filebuf local_218 [24];
  uint auStack_200 [54];
  ios_base local_128 [264];
  
  bVar2 = fs_set_modtime(path,true);
  bVar3 = true;
  if (!bVar2) {
    std::ofstream::ofstream(&local_220,path._M_str,_S_out);
    uVar1 = *(uint *)((long)auStack_200 + *(long *)(local_220 + -0x18));
    if ((uVar1 & 5) == 0) {
      std::ofstream::close();
    }
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = __M_split_cmpts;
    std::filebuf::~filebuf(local_218);
    std::ios_base::~ios_base(local_128);
    if ((uVar1 & 5) != 0) {
      fname._M_str = "fs_touch";
      fname._M_len = 8;
      fs_print_error(path,fname);
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool fs_touch(std::string_view path)
{
  if(fs_set_modtime(path, true))
    return true;

  if(std::ofstream f(path.data()); f){
    f.close();
    return true;
  }

  fs_print_error(path, __func__);
  return false;
}